

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O0

void __thiscall
cnn::ShadowLookupParameters::ShadowLookupParameters
          (ShadowLookupParameters *this,LookupParameters *lp)

{
  long *plVar1;
  bool bVar2;
  uint uVar3;
  reference pTVar4;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_RSI;
  Tensor *t;
  iterator __end1;
  iterator __begin1;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_ffffffffffffff98;
  Dim *in_stack_ffffffffffffffa0;
  __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_> local_20
  ;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *in_stack_ffffffffffffffe8;
  
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(in_RSI,in_stack_ffffffffffffffe8);
  local_20._M_current =
       (Tensor *)
       std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::begin(in_stack_ffffffffffffff98);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar2) break;
    pTVar4 = __gnu_cxx::
             __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>
             ::operator*(&local_20);
    plVar1 = *(long **)(default_device + 0x10);
    uVar3 = Dim::size(in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = (Dim *)(**(code **)(*plVar1 + 0x10))(plVar1,(ulong)uVar3 << 2);
    pTVar4->v = (float *)in_stack_ffffffffffffffa0;
    TensorTools::Zero((Tensor *)0x7b6eb1);
    __gnu_cxx::
    __normal_iterator<cnn::Tensor_*,_std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>_>::
    operator++(&local_20);
  }
  return;
}

Assistant:

ShadowLookupParameters::ShadowLookupParameters(const LookupParameters& lp) : h(lp.values) {
  for (auto& t : h) {
    t.v = (float*)default_device->mem->malloc(t.d.size() * sizeof(float));
    TensorTools::Zero(t);
  }
}